

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O1

void __thiscall tf::TFProfObserver::dump(TFProfObserver *this,ostream *os)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  ostream *poVar6;
  pointer pvVar7;
  size_t sVar8;
  pointer *ppvVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  bool bVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  char local_5b [3];
  long local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  TFProfObserver *local_38;
  
  pvVar1 = (this->_timeline).segments.
           super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->_timeline).segments.
           super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = ((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555;
  if (pvVar2 == pvVar1) {
    uVar16 = 0;
  }
  else {
    uVar10 = uVar5 + (uVar5 == 0);
    ppvVar9 = &(pvVar1->
               super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    uVar15 = 0;
    do {
      uVar16 = uVar15;
      if (*ppvVar9 != ((_Vector_impl_data *)(ppvVar9 + -1))->_M_start) break;
      uVar15 = uVar15 + 1;
      ppvVar9 = ppvVar9 + 3;
      uVar16 = uVar10;
    } while (uVar10 != uVar15);
  }
  if (uVar16 == uVar5) {
    pcVar11 = "{}\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"{\"executor\":\"",0xd);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\",\"data\":[",10);
    pcVar11 = "]}\n";
    if (uVar16 < (ulong)(((long)(this->_timeline).segments.
                                super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_timeline).segments.
                                super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x5555555555555555)) {
      bVar13 = false;
      local_38 = this;
      do {
        pvVar1 = (this->_timeline).segments.
                 super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_58 = uVar16 * 3;
        pvVar7 = pvVar1[uVar16].
                 super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar1[uVar16].
                     super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                     ._M_impl.super__Vector_impl_data + 8) != pvVar7) {
          uVar5 = 0;
          local_50 = uVar16;
          do {
            local_48 = uVar5 * 3;
            if (pvVar7[uVar5].super__Vector_base<tf::Segment,_std::allocator<tf::Segment>_>._M_impl.
                super__Vector_impl_data._M_start !=
                *(pointer *)
                 ((long)&pvVar7[uVar5].super__Vector_base<tf::Segment,_std::allocator<tf::Segment>_>
                         ._M_impl.super__Vector_impl_data + 8)) {
              bVar4 = true;
              if (bVar13) {
                local_5b[0] = ',';
                std::__ostream_insert<char,std::char_traits<char>>(os,local_5b,1);
                bVar4 = bVar13;
              }
              std::__ostream_insert<char,std::char_traits<char>>(os,"{\"worker\":",10);
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)os);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,",\"level\":",9);
              local_40 = uVar5;
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,",\"data\":[",9);
              lVar12 = *(long *)((long)&(((this->_timeline).segments.
                                          super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                        )._M_impl.super__Vector_impl_data + local_58 * 8);
              lVar14 = *(long *)(lVar12 + local_48 * 8);
              if (*(long *)(lVar12 + 8 + local_48 * 8) != lVar14) {
                lVar12 = 0x30;
                uVar5 = 0;
                do {
                  if (uVar5 != 0) {
                    local_5b[1] = 0x2c;
                    std::__ostream_insert<char,std::char_traits<char>>(os,local_5b + 1,1);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(os,"{\"span\":[",9);
                  poVar6 = std::ostream::_M_insert<long>((long)os);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
                  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"],",2);
                  std::__ostream_insert<char,std::char_traits<char>>(os,"\"name\":\"",8);
                  lVar3 = *(long *)(lVar14 + -0x28 + lVar12);
                  if (lVar3 == 0) {
                    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)os);
                    local_5b[2] = 0x5f;
                    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar6,local_5b + 2,1);
                    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              (os,*(char **)(lVar14 + -0x30 + lVar12),lVar3);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(os,"\",",2);
                  std::__ostream_insert<char,std::char_traits<char>>(os,"\"type\":\"",8);
                  uVar16 = (ulong)*(uint *)(lVar14 + -0x10 + lVar12);
                  pcVar11 = "undefined";
                  if (uVar16 < 7) {
                    pcVar11 = (&PTR_anon_var_dwarf_33e59_00117be0)[uVar16];
                  }
                  sVar8 = strlen(pcVar11);
                  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar11,sVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
                  std::__ostream_insert<char,std::char_traits<char>>(os,"}",1);
                  uVar5 = uVar5 + 1;
                  lVar3 = *(long *)((long)&(((local_38->_timeline).segments.
                                             super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                           )._M_impl.super__Vector_impl_data + local_58 * 8);
                  lVar14 = *(long *)(lVar3 + local_48 * 8);
                  lVar12 = lVar12 + 0x38;
                  this = local_38;
                } while (uVar5 < (ulong)((*(long *)(lVar3 + 8 + local_48 * 8) - lVar14 >> 3) *
                                        0x6db6db6db6db6db7));
              }
              std::__ostream_insert<char,std::char_traits<char>>(os,"]}",2);
              uVar5 = local_40;
              uVar16 = local_50;
              bVar13 = bVar4;
            }
            uVar5 = uVar5 + 1;
            pvVar1 = (this->_timeline).segments.
                     super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar7 = *(pointer *)
                      ((long)&(pvVar1->
                              super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                              )._M_impl.super__Vector_impl_data + local_58 * 8);
          } while (uVar5 < (ulong)((*(long *)((long)&(pvVar1->
                                                  super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                                  )._M_impl.super__Vector_impl_data +
                                             local_58 * 8 + 8) - (long)pvVar7 >> 3) *
                                  -0x5555555555555555));
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < (ulong)(((long)(this->_timeline).segments.
                                       super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->_timeline).segments.
                                       super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
      pcVar11 = "]}\n";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar11,3);
  return;
}

Assistant:

inline void TFProfObserver::dump(std::ostream& os) const {

  using namespace std::chrono;

  size_t first;

  for(first = 0; first<_timeline.segments.size(); ++first) {
    if(_timeline.segments[first].size() > 0) { 
      break; 
    }
  }
  
  // not timeline data to dump
  if(first == _timeline.segments.size()) {
    os << "{}\n";
    return;
  }

  os << "{\"executor\":\"" << _timeline.uid << "\",\"data\":[";

  bool comma = false;

  for(size_t w=first; w<_timeline.segments.size(); w++) {
    for(size_t l=0; l<_timeline.segments[w].size(); l++) {

      if(_timeline.segments[w][l].empty()) {
        continue;
      }

      if(comma) {
        os << ',';
      }
      else {
        comma = true;
      }

      os << "{\"worker\":" << w << ",\"level\":" << l << ",\"data\":[";
      for(size_t i=0; i<_timeline.segments[w][l].size(); ++i) {

        const auto& s = _timeline.segments[w][l][i];

        if(i) os << ',';
        
        // span 
        os << "{\"span\":[" 
           << duration_cast<microseconds>(s.beg - _timeline.origin).count() 
           << ","
           << duration_cast<microseconds>(s.end - _timeline.origin).count() 
           << "],";
        
        // name
        os << "\"name\":\""; 
        if(s.name.empty()) {
          os << w << '_' << i;
        }
        else {
          os << s.name;
        }
        os << "\",";
    
        // e.g., category "type": "Condition Task"
        os << "\"type\":\"" << to_string(s.type) << "\"";

        os << "}";
      }
      os << "]}";
    }
  }

  os << "]}\n";
}